

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O2

void __thiscall Wall::do_ball(Wall *this,actor_ref *param_1,msg_ball *param_2)

{
  int iVar1;
  msg_ball local_9;
  
  if (this->m_finished == false) {
    this->m_counter = this->m_counter + 1;
    iVar1 = rand();
    acto::actor_ref::send<msg_ball>(this->m_players + iVar1 % 10000,&local_9);
  }
  return;
}

Assistant:

void do_ball(acto::actor_ref, const msg_ball&) {
    if (!m_finished) {
      // Увеличить счетчик отскоков от стены
      m_counter++;
      // Послать случайно выбранному игроку
      m_players[ (rand() % PLAYERS) ].send(msg_ball());
    }
  }